

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiddle~.c
# Opt level: O0

int sigfiddle_setnpoints(t_sigfiddle *x,t_floatarg fnpoints)

{
  int iVar1;
  t_float *ptVar2;
  double dVar3;
  int local_24;
  int local_20;
  int npoints;
  int i;
  t_floatarg fnpoints_local;
  t_sigfiddle *x_local;
  
  local_24 = (int)fnpoints;
  sigfiddle_freebird(x);
  if ((local_24 < 0x80) || (0x2000 < local_24)) {
    local_24 = 0x400;
    pd_error((void *)0x0,"fiddle~: npoints out of range; using %d",0x400);
  }
  iVar1 = sigfiddle_ilog2(local_24);
  if (local_24 != 1 << ((byte)iVar1 & 0x1f)) {
    iVar1 = sigfiddle_ilog2(local_24);
    local_24 = 1 << ((byte)iVar1 & 0x1f);
    pd_error((void *)0x0,"fiddle~: npoints not a power of 2; using %d");
  }
  x->x_hop = local_24 >> 1;
  ptVar2 = (t_float *)getbytes((long)x->x_hop << 2);
  x->x_inbuf = ptVar2;
  if (ptVar2 != (t_float *)0x0) {
    ptVar2 = (t_float *)getbytes((long)(x->x_hop * 2 + 0x14) << 2);
    x->x_lastanalysis = ptVar2;
    if (ptVar2 != (t_float *)0x0) {
      ptVar2 = (t_float *)getbytes((long)x->x_hop << 3);
      x->x_spiral = ptVar2;
      if (ptVar2 != (t_float *)0x0) {
        for (local_20 = 0; local_20 < x->x_hop; local_20 = local_20 + 1) {
          x->x_inbuf[local_20] = 0.0;
        }
        for (local_20 = 0; local_20 < local_24 + 0x14; local_20 = local_20 + 1) {
          x->x_lastanalysis[local_20] = 0.0;
        }
        for (local_20 = 0; local_20 < x->x_hop; local_20 = local_20 + 1) {
          dVar3 = cos(((double)local_20 * 3.14159) / (double)local_24);
          x->x_spiral[local_20 << 1] = (float)dVar3;
          dVar3 = sin(((double)local_20 * 3.14159) / (double)local_24);
          x->x_spiral[local_20 * 2 + 1] = (float)-dVar3;
        }
        x->x_phase = 0;
        return 1;
      }
    }
  }
  sigfiddle_freebird(x);
  return 0;
}

Assistant:

int sigfiddle_setnpoints(t_sigfiddle *x, t_floatarg fnpoints)
{
    int i, npoints = fnpoints;
    sigfiddle_freebird(x);
    if (npoints < MINPOINTS || npoints > MAXPOINTS)
    {
        pd_error(0, "fiddle~: npoints out of range; using %d",
            npoints = DEFAULTPOINTS);
    }
    if (npoints != (1 << sigfiddle_ilog2(npoints)))
    {
        pd_error(0, "fiddle~: npoints not a power of 2; using %d",
            npoints = (1 << sigfiddle_ilog2(npoints)));
    }
    x->x_hop = npoints >> 1;
    if (!(x->x_inbuf = (t_float *)getbytes(sizeof(t_float) * x->x_hop)))
        goto fail;
    if (!(x->x_lastanalysis = (t_float *)getbytes(
        sizeof(t_float) * (2 * x->x_hop + 4 * FILTSIZE))))
            goto fail;
    if (!(x->x_spiral = (t_float *)getbytes(sizeof(t_float) * 2 * x->x_hop)))
        goto fail;
    for (i = 0; i < x->x_hop; i++)
        x->x_inbuf[i] = 0;
    for (i = 0; i < npoints + 4 * FILTSIZE; i++)
        x->x_lastanalysis[i] = 0;
    for (i = 0; i < x->x_hop; i++)
        x->x_spiral[2*i] =    cos((3.14159*i)/(npoints)),
        x->x_spiral[2*i+1] = -sin((3.14159*i)/(npoints));
    x->x_phase = 0;
    return (1);
fail:
    sigfiddle_freebird(x);
    return (0);
}